

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::TestEventRepeater::~TestEventRepeater(TestEventRepeater *this)

{
  (this->super_TestEventListener)._vptr_TestEventListener =
       (_func_int **)&PTR__TestEventRepeater_00140068;
  ForEach<std::vector<testing::TestEventListener*,std::allocator<testing::TestEventListener*>>,void(*)(testing::TestEventListener*)>
            (&this->listeners_,Delete<testing::TestEventListener>);
  std::_Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::
  ~_Vector_base(&(this->listeners_).
                 super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
               );
  return;
}

Assistant:

TestEventRepeater::~TestEventRepeater() {
  ForEach(listeners_, Delete<TestEventListener>);
}